

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testBoxAlgo.cpp
# Opt level: O0

void anon_unknown.dwarf_28a62::testPerturbedRayBox(Box3f *box,Line3f *ray,bool result)

{
  bool bVar1;
  uint uVar2;
  ostream *poVar3;
  void *this;
  byte in_DL;
  Vec3<float> *in_stack_00000008;
  V3f ip_1;
  Box<Imath_2_5::Vec3<float>_> *in_stack_00000018;
  Line3f ray1;
  int i;
  float e;
  Rand48 random;
  V3f ip;
  undefined4 in_stack_ffffffffffffff88;
  uint in_stack_ffffffffffffff8c;
  undefined4 in_stack_ffffffffffffff90;
  float in_stack_ffffffffffffff94;
  float in_stack_ffffffffffffff9c;
  Rand48 *in_stack_ffffffffffffffa8;
  Vec3<float> VStack_3c;
  int local_30;
  undefined4 local_2c;
  Vec3<float> local_20;
  byte local_11;
  
  local_11 = in_DL & 1;
  std::operator<<((ostream *)&std::cout,"    dir ~ ");
  poVar3 = Imath_2_5::operator<<
                     ((ostream *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                      (Vec3<float> *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  poVar3 = std::operator<<(poVar3,", result = ");
  this = (void *)std::ostream::operator<<(poVar3,(bool)(local_11 & 1));
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  Imath_2_5::Vec3<float>::Vec3(&local_20);
  uVar2 = (uint)(local_11 & 1);
  bVar1 = Imath_2_5::intersects<float>
                    (in_stack_00000018,(Line3<float> *)ip_1._4_8_,in_stack_00000008);
  if (uVar2 != bVar1) {
    __assert_fail("result == intersects (box, ray, ip)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testBoxAlgo.cpp"
                  ,0x2f7,
                  "void (anonymous namespace)::testPerturbedRayBox(const Box3f &, const Line3f &, bool)"
                 );
  }
  Imath_2_5::Rand48::Rand48
            ((Rand48 *)CONCAT44(in_stack_ffffffffffffff94,uVar2),
             CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  local_2c = 0x15f79688;
  local_30 = 0;
  while( true ) {
    if (9999 < local_30) {
      return;
    }
    Imath_2_5::Line3<float>::Line3
              ((Line3<float> *)CONCAT44(in_stack_ffffffffffffff94,uVar2),
               (Line3<float> *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    Imath_2_5::solidSphereRand<Imath_2_5::Vec3<float>,Imath_2_5::Rand48>(in_stack_ffffffffffffffa8);
    Imath_2_5::operator*
              (in_stack_ffffffffffffff9c,(Vec3<float> *)CONCAT44(in_stack_ffffffffffffff94,uVar2));
    Imath_2_5::Vec3<float>::operator+=(&VStack_3c,(Vec3<float> *)&stack0xffffffffffffffac);
    Imath_2_5::Vec3<float>::Vec3((Vec3<float> *)&stack0xffffffffffffff94);
    in_stack_ffffffffffffff8c = (uint)(local_11 & 1);
    bVar1 = Imath_2_5::intersects<float>
                      (in_stack_00000018,(Line3<float> *)ip_1._4_8_,in_stack_00000008);
    if (in_stack_ffffffffffffff8c != bVar1) break;
    local_30 = local_30 + 1;
  }
  __assert_fail("result == intersects (box, ray1, ip)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testBoxAlgo.cpp"
                ,0x303,
                "void (anonymous namespace)::testPerturbedRayBox(const Box3f &, const Line3f &, bool)"
               );
}

Assistant:

void
testPerturbedRayBox
    (const Box3f &box,
     const Line3f &ray,
     bool result)
{
    cout << "    dir ~ " << ray.dir << ", result = " << result << endl;

    {
	V3f ip;
	assert (result == intersects (box, ray, ip));
    }

    Rand48 random (19);
    const float e = 1e-25f;

    for (int i = 0; i < 10000; ++i)
    {
	Line3f ray1 (ray);
	ray1.dir += e * solidSphereRand<V3f> (random);

	V3f ip;
	assert (result == intersects (box, ray1, ip));
    }
}